

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

bool __thiscall Spi::sync_mpsse(Spi *this)

{
  int iVar1;
  ostream *this_00;
  bool local_51;
  uint uStack_3c;
  bool bCommandEchod;
  FT_STATUS ftStatus;
  DWORD dwNumBytesRead;
  DWORD dwNumBytesToRead;
  DWORD dwNumBytesSent;
  DWORD dwNumBytesToSend;
  DWORD dwCount;
  BYTE byInputBuffer [8];
  BYTE byOutputBuffer [8];
  Spi *this_local;
  
  dwNumBytesSent = 0;
  dwNumBytesRead = 0;
  ftStatus = 0;
  uStack_3c = 0;
  dwNumBytesToRead = 1;
  byInputBuffer[0] = 0xaa;
  FT_Write(this->ftHandle,byInputBuffer,1,&dwNumBytesRead);
  dwNumBytesToRead = 0;
  do {
    iVar1 = FT_GetQueueStatus(this->ftHandle,&ftStatus);
    local_51 = ftStatus == 0 && iVar1 == 0;
  } while (local_51);
  if (uStack_3c < 9) {
    FT_Read(this->ftHandle,&dwNumBytesToSend,ftStatus,&stack0xffffffffffffffc4);
    for (dwNumBytesSent = 0; dwNumBytesSent < uStack_3c - 1; dwNumBytesSent = dwNumBytesSent + 1) {
      if ((*(char *)((long)&dwNumBytesToSend + (ulong)dwNumBytesSent) == -6) &&
         (*(char *)((long)&dwNumBytesToSend + (ulong)(dwNumBytesSent + 1)) == -0x56)) {
        return true;
      }
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Input buffer too small in sync_mpsse()!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return false;
}

Assistant:

bool Spi::sync_mpsse() {
	BYTE byOutputBuffer[8]; // Buffer to hold MPSSE commands and data to be sent to the FT2232H
	BYTE byInputBuffer[8]; // Buffer to hold data read from the FT2232H
	DWORD dwCount = 0; // General loop index
	DWORD dwNumBytesToSend = 0; // Index to the output buffer
	DWORD dwNumBytesSent = 0; // Count of actual bytes sent - used with FT_Write
	DWORD dwNumBytesToRead = 0; // Number of bytes available to read in the driver's input buffer
	DWORD dwNumBytesRead = 0; // Count of actual bytes read - used with FT_Read
	FT_STATUS ftStatus;

	byOutputBuffer[dwNumBytesToSend++] = 0xAA;	//'\xAA';
	//Add bogus command ‘xAA’ to the queue
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the BAD commands
	dwNumBytesToSend = 0; // Reset output buffer pointer
	do {
		ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
		// Get the number of bytes in the device input buffer
	} while ((dwNumBytesToRead == 0) && (ftStatus == FT_OK));
	if (dwNumBytesRead > 8) {
		cerr << "Input buffer too small in sync_mpsse()!" << endl;
		return false;
	}
	//or Timeout
	bool bCommandEchod = false;
	ftStatus = FT_Read(ftHandle, &byInputBuffer, dwNumBytesToRead,
			&dwNumBytesRead);
	//Read out the data from input buffer
	for (dwCount = 0; dwCount < dwNumBytesRead - 1; dwCount++)
	//Check if Bad command and echo command received
			{
		if ((byInputBuffer[dwCount] == 0xFA)
				&& (byInputBuffer[dwCount + 1] == 0xAA)) {
			bCommandEchod = true;
			break;
		}
	}

	return bCommandEchod;
}